

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QWidgetItemData>::moveAppend
          (QGenericArrayOps<QWidgetItemData> *this,QWidgetItemData *b,QWidgetItemData *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  QWidgetItemData *pQVar3;
  long lVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (b != e) {
    pQVar3 = (this->super_QArrayDataPointer<QWidgetItemData>).ptr;
    for (; b < e; b = b + 1) {
      lVar4 = (this->super_QArrayDataPointer<QWidgetItemData>).size;
      pQVar3[lVar4].role = b->role;
      pPVar5 = (b->value).d.data.shared;
      uVar6 = *(undefined8 *)((long)&(b->value).d.data + 8);
      uVar7 = *(undefined8 *)&(b->value).d.field_0x18;
      puVar2 = (undefined8 *)((long)&pQVar3[lVar4].value.d.data + 0x10);
      *puVar2 = *(undefined8 *)((long)&(b->value).d.data + 0x10);
      puVar2[1] = uVar7;
      pQVar3[lVar4].value.d.data.shared = pPVar5;
      *(undefined8 *)((long)&pQVar3[lVar4].value.d.data + 8) = uVar6;
      (b->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->value).d.data + 0x10) = 0;
      *(undefined8 *)&(b->value).d.field_0x18 = 2;
      pqVar1 = &(this->super_QArrayDataPointer<QWidgetItemData>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }